

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread_pthread.c
# Opt level: O0

void * evthread_posix_cond_alloc(uint condflags)

{
  int iVar1;
  pthread_cond_t *cond;
  pthread_cond_t *ppStack_10;
  uint condflags_local;
  
  ppStack_10 = (pthread_cond_t *)event_mm_malloc_(0x30);
  if (ppStack_10 == (pthread_cond_t *)0x0) {
    ppStack_10 = (pthread_cond_t *)0x0;
  }
  else {
    iVar1 = pthread_cond_init(ppStack_10,(pthread_condattr_t *)0x0);
    if (iVar1 != 0) {
      event_mm_free_(ppStack_10);
      ppStack_10 = (pthread_cond_t *)0x0;
    }
  }
  return ppStack_10;
}

Assistant:

static void *
evthread_posix_cond_alloc(unsigned condflags)
{
	pthread_cond_t *cond = mm_malloc(sizeof(pthread_cond_t));
	if (!cond)
		return NULL;
	if (pthread_cond_init(cond, NULL)) {
		mm_free(cond);
		return NULL;
	}
	return cond;
}